

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperBase::DisposeLocalMinimaList(ClipperBase *this)

{
  LocalMinima *pLVar1;
  LocalMinima *pLVar2;
  
  pLVar2 = this->m_MinimaList;
  while (pLVar2 != (LocalMinima *)0x0) {
    pLVar1 = pLVar2->next;
    operator_delete(pLVar2);
    this->m_MinimaList = pLVar1;
    pLVar2 = pLVar1;
  }
  this->m_CurrentLM = (LocalMinima *)0x0;
  return;
}

Assistant:

void ClipperBase::DisposeLocalMinimaList()
{
  while( m_MinimaList )
  {
    LocalMinima* tmpLm = m_MinimaList->next;
    delete m_MinimaList;
    m_MinimaList = tmpLm;
  }
  m_CurrentLM = 0;
}